

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luartmidi.cpp
# Opt level: O0

int luaopen_luartmidi(lua_State *L)

{
  lua_State *plVar1;
  _func_int_lua_State_ptr *p_Var2;
  __0 local_11;
  lua_State *local_10;
  lua_State *L_local;
  
  local_10 = L;
  lua_createtable(L,0,4);
  lua_pushlstring(local_10,"sleep",5);
  plVar1 = local_10;
  p_Var2 = luaopen_luartmidi::$_0::operator_cast_to_function_pointer(&local_11);
  lua_pushcclosure(plVar1,p_Var2,0);
  lua_rawset(local_10,0xfffffffd);
  lua_pushlstring(local_10,"RtMidi",6);
  luaopen_luartmidi_rtmidi(local_10);
  lua_rawset(local_10,0xfffffffd);
  lua_pushlstring(local_10,"RtMidiIn",8);
  luaopen_luartmidi_rtmidiin(local_10);
  lua_rawset(local_10,0xfffffffd);
  lua_pushlstring(local_10,"RtMidiOut",9);
  luaopen_luartmidi_rtmidiout(local_10);
  lua_rawset(local_10,0xfffffffd);
  lua_pushlstring(local_10,"RtMidiError",0xb);
  luaopen_luartmidi_rtmidierror(local_10);
  lua_rawset(local_10,0xfffffffd);
  return 1;
}

Assistant:

LUA_RTMIDI_API int luaopen_luartmidi(lua_State *L) {
	lua_createtable(L, 0, 4);

	lua_pushliteral(L, "sleep");
	lua_pushcfunction(L, [] (lua_State *L) {
		auto s = std::chrono::duration<lua_Number>(luaL_checknumber(L, 1));
		std::this_thread::sleep_for(s);
		return 0;
	});
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidi");
	luaopen_luartmidi_rtmidi(L);
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidiIn");
	luaopen_luartmidi_rtmidiin(L);
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidiOut");
	luaopen_luartmidi_rtmidiout(L);
	lua_rawset(L, -3);

	lua_pushliteral(L, "RtMidiError");
	luaopen_luartmidi_rtmidierror(L);
	lua_rawset(L, -3);

	return 1;
}